

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_role_transition(lws *wsi,lwsi_role role,lwsi_state state,lws_role_ops *ops)

{
  char *pcVar1;
  
  wsi->wsistate = role | state;
  if (ops == (lws_role_ops *)0x0) {
    ops = wsi->role_ops;
    if (ops == (lws_role_ops *)0x0) {
      pcVar1 = "(unset)";
      goto LAB_00127e04;
    }
  }
  else {
    wsi->role_ops = ops;
  }
  pcVar1 = ops->name;
LAB_00127e04:
  _lws_log_cx((wsi->lc).log_cx,lws_log_prepend_wsi,wsi,0x10,"lws_role_transition",
              "wsistate 0x%lx, ops %s",(ulong)(role | state),pcVar1,wsi);
  return;
}

Assistant:

void
lws_role_transition(struct lws *wsi, enum lwsi_role role, enum lwsi_state state,
		    const struct lws_role_ops *ops)
{
#if (_LWS_ENABLED_LOGS & LLL_DEBUG) 
	const char *name = "(unset)";
#endif
	wsi->wsistate = (unsigned int)role | (unsigned int)state;
	if (ops)
		wsi->role_ops = ops;
#if (_LWS_ENABLED_LOGS & LLL_DEBUG)
	if (wsi->role_ops)
		name = wsi->role_ops->name;
	lwsl_wsi_debug(wsi, "wsistate 0x%lx, ops %s",
			    (unsigned long)wsi->wsistate, name);
#endif
}